

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

int __thiscall application::run(application *this,int argc,char **argv)

{
  undefined8 __p;
  char *pcVar1;
  typed_value<unsigned_short,_char> *ptVar2;
  size_type sVar3;
  uint16_t port;
  variables_map variables;
  options_description options;
  unsigned_short local_194;
  allocator<char> local_191;
  undefined1 local_190 [48];
  __node_base_ptr p_Stack_160;
  undefined8 local_158;
  undefined1 auStack_150 [16];
  _Base_ptr local_140 [2];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_130 [144];
  options_description local_a0 [128];
  
  local_194 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_140,"Options",(allocator<char> *)local_190);
  boost::program_options::options_description::options_description
            (local_a0,(string *)local_140,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)local_140);
  local_140[0] = (_Base_ptr)boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_140,"help");
  ptVar2 = boost::program_options::value<unsigned_short>(&local_194);
  local_190._0_2_ = 0x2694;
  ptVar2 = boost::program_options::typed_value<unsigned_short,_char>::default_value
                     (ptVar2,(unsigned_short *)local_190);
  boost::program_options::options_description_easy_init::operator()
            (pcVar1,(value_semantic *)0x11f444,(char *)ptVar2);
  boost::program_options::variables_map::variables_map((variables_map *)local_140);
  local_190._40_8_ = 0;
  p_Stack_160 = (__node_base_ptr)0x0;
  local_158._0_4_ = 0;
  local_158._4_4_ = 0;
  auStack_150._0_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_190,argc,argv,local_a0,0,
             (function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)(local_190 + 0x28));
  boost::program_options::store((basic_parsed_options *)local_190,(variables_map *)local_140,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_190);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)(local_190 + 0x28));
  boost::program_options::notify((variables_map *)local_140);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_190,"help",&local_191);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_130,(key_type *)local_190);
  std::__cxx11::string::~string((string *)local_190);
  if (sVar3 == 0) {
    std::make_unique<cab_server,application&,boost::asio::io_context&,unsigned_short&>
              ((application *)local_190,(io_context *)this,(unsigned_short *)&this->_io_service);
    __p = local_190._0_8_;
    local_190._0_8_ = (pointer)0x0;
    std::__uniq_ptr_impl<cab_server,_std::default_delete<cab_server>_>::reset
              ((__uniq_ptr_impl<cab_server,_std::default_delete<cab_server>_> *)&this->_cab_server,
               (pointer)__p);
    std::unique_ptr<cab_server,_std::default_delete<cab_server>_>::~unique_ptr
              ((unique_ptr<cab_server,_std::default_delete<cab_server>_> *)local_190);
    cab_server::run((this->_cab_server)._M_t.
                    super___uniq_ptr_impl<cab_server,_std::default_delete<cab_server>_>._M_t.
                    super__Tuple_impl<0UL,_cab_server_*,_std::default_delete<cab_server>_>.
                    super__Head_base<0UL,_cab_server_*,_false>._M_head_impl);
    boost::asio::io_context::run(&this->_io_service);
  }
  else {
    boost::program_options::operator<<((ostream *)&std::cout,local_a0);
  }
  boost::program_options::variables_map::~variables_map((variables_map *)local_140);
  boost::program_options::options_description::~options_description(local_a0);
  return 0;
}

Assistant:

int application::run(int argc, char** argv)
{
    std::uint16_t port = 0;

    boost::program_options::options_description options("Options");
    options.add_options()
        ("help", "shows this message")
        ("port", boost::program_options::value<std::uint16_t>(&port)->default_value(9876), "sets the cab server port");

    boost::program_options::variables_map variables;
    boost::program_options::store(boost::program_options::parse_command_line(argc, argv, options), variables);
    boost::program_options::notify(variables);

    if(variables.count("help"))
    {
        std::cout << options;
        return 0;
    }

    _cab_server = std::make_unique<cab_server>(*this, _io_service, port);

    _cab_server->run();
    _io_service.run();

    return 0;
}